

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
          (QMultiHash<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *args)

{
  QByteArray *in_RCX;
  QMultiHash<QByteArray,_QByteArray> *in_RDX;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QByteArray *args_00;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = &local_20;
  QByteArray::QByteArray((QByteArray *)in_RDI,(QByteArray *)in_RDI);
  emplace<QByteArray_const&>(in_RDX,in_RCX,args_00);
  QByteArray::~QByteArray((QByteArray *)0x1264cf);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        return emplace(Key(key), std::forward<Args>(args)...);
    }